

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ospf-packet.cc
# Opt level: O1

void __thiscall LsuContent::LsuContent(LsuContent *this,istream *is)

{
  uint uVar1;
  char cVar2;
  uint uVar3;
  uint32_t *puVar4;
  undefined1 auVar5 [16];
  shared_ptr<RouterLsa> lsa;
  LsaHeader temp_header;
  NetworkLsa *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  NetworkLsa *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  vector<std::shared_ptr<Lsa>,std::allocator<std::shared_ptr<Lsa>>> *local_50;
  undefined1 local_44 [3];
  char local_41;
  ushort local_32;
  
  (this->super_OspfContent)._vptr_OspfContent = (_func_int **)&PTR__LsuContent_00120528;
  local_50 = (vector<std::shared_ptr<Lsa>,std::allocator<std::shared_ptr<Lsa>>> *)&this->lsas;
  (this->lsas).super__Vector_base<std::shared_ptr<Lsa>,_std::allocator<std::shared_ptr<Lsa>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lsas).super__Vector_base<std::shared_ptr<Lsa>,_std::allocator<std::shared_ptr<Lsa>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lsas).super__Vector_base<std::shared_ptr<Lsa>,_std::allocator<std::shared_ptr<Lsa>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar4 = &this->lsa_num;
  std::istream::read((char *)is,(long)puVar4);
  uVar1 = *puVar4;
  uVar3 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  *puVar4 = uVar3;
  if (uVar1 != 0) {
    do {
      auVar5 = std::istream::tellg();
      std::istream::read((char *)is,(long)local_44);
      cVar2 = local_41;
      std::istream::seekg(is,auVar5._0_8_,auVar5._8_8_);
      if (cVar2 == '\x02') {
        local_70 = (NetworkLsa *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<NetworkLsa,std::allocator<NetworkLsa>,std::istream&>
                  (&local_68,&local_70,(_Sp_alloc_shared_tag<std::allocator<NetworkLsa>_>)&local_60,
                   is);
        local_60 = local_70;
        local_58 = local_68._M_pi;
        if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
          }
        }
        std::vector<std::shared_ptr<Lsa>,std::allocator<std::shared_ptr<Lsa>>>::
        emplace_back<std::shared_ptr<Lsa>>(local_50,(shared_ptr<Lsa> *)&local_60);
LAB_001154af:
        if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
        }
        if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
        }
      }
      else {
        if (cVar2 == '\x01') {
          local_70 = (NetworkLsa *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<RouterLsa,std::allocator<RouterLsa>,std::istream&>
                    (&local_68,(RouterLsa **)&local_70,(allocator<RouterLsa> *)&local_60,is);
          local_60 = local_70;
          local_58 = local_68._M_pi;
          if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
            }
          }
          std::vector<std::shared_ptr<Lsa>,std::allocator<std::shared_ptr<Lsa>>>::
          emplace_back<std::shared_ptr<Lsa>>(local_50,(shared_ptr<Lsa> *)&local_60);
          goto LAB_001154af;
        }
        std::istream::seekg((long)is,(uint)local_32);
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

LsuContent::LsuContent(std::istream& is)
{
    is.read((char*)&lsa_num, 4);
    lsa_num      = ntohl(lsa_num);
    uint32_t num = lsa_num;
    while (num != 0)
    {
        //取得lsa的type并将istream恢复位置
        LsaHeader temp_header;
        auto      pos = is.tellg();
        is.read((char*)&temp_header, sizeof(LsaHeader));
        uint8_t lsa_type = temp_header.lsa_type;
        is.seekg(pos);

        //根据type创建不同的lsa
        if (lsa_type == 1)  // router-lsa
        {
            auto lsa = std::make_shared<RouterLsa>(is);
            lsas.push_back(lsa);
        }
        else if (lsa_type == 2)  // network-lsa
        {
            auto lsa = std::make_shared<NetworkLsa>(is);
            lsas.push_back(lsa);
        }
        else  //其他lsa跳过 TODO
        {
            // std::cout << "ignore other lsa -- type: " << (uint16_t)lsa_type
            // << '\n';
            is.seekg(temp_header.tlen, std::ios::cur);
        }

        --num;
    }
}